

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_reg_t to_reg(MIR_context_t ctx,uint64_t reg_str_num,MIR_item_t_conflict func)

{
  MIR_reg_t MVar1;
  MIR_str_t MVar2;
  
  MVar2 = to_str(ctx,reg_str_num);
  process_reserved_name(MVar2.s,"t",&((func->u).func)->last_temp_num);
  MVar1 = MIR_reg(ctx,MVar2.s,(func->u).func);
  return MVar1;
}

Assistant:

static MIR_reg_t to_reg (MIR_context_t ctx, uint64_t reg_str_num, MIR_item_t func) {
  const char *s = to_str (ctx, reg_str_num).s;

  process_reserved_name (s, TEMP_REG_NAME_PREFIX, &func->u.func->last_temp_num);
  return MIR_reg (ctx, s, func->u.func);
}